

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O0

DdTlcInfo * computeClausesWithUniverse(DdTlcInfo *Cres,DdHalfWord label,short phase)

{
  DdHalfWord *pDVar1;
  BitVector *vector;
  short sVar2;
  int iVar3;
  DdTlcInfo *t;
  BitVector *vector_00;
  int local_4c;
  int i;
  DdTlcInfo *res;
  BitVector *Vcp;
  DdHalfWord *Vcv;
  BitVector *Ccp;
  DdHalfWord *Ccv;
  short phase_local;
  DdHalfWord label_local;
  DdTlcInfo *Cres_local;
  
  pDVar1 = Cres->vars;
  vector = Cres->phases;
  Vcp = (BitVector *)0x0;
  t = tlcInfoAlloc();
  if (t != (DdTlcInfo *)0x0) {
    local_4c = 0;
    while (iVar3 = sentinelp(pDVar1[local_4c],pDVar1[local_4c + 1]), iVar3 == 0) {
      local_4c = local_4c + 2;
    }
    Vcp = (BitVector *)malloc((long)(local_4c + 4) << 2);
    if (((DdHalfWord *)Vcp != (DdHalfWord *)0x0) &&
       (vector_00 = bitVectorAlloc(local_4c + 4), vector_00 != (BitVector *)0x0)) {
      t->vars = (DdHalfWord *)Vcp;
      t->phases = vector_00;
      local_4c = 0;
      while (iVar3 = sentinelp(pDVar1[local_4c],pDVar1[local_4c + 1]), iVar3 == 0) {
        *(DdHalfWord *)((long)Vcp + (long)local_4c * 4) = pDVar1[local_4c];
        *(DdHalfWord *)((long)Vcp + (long)(local_4c + 1) * 4) = pDVar1[local_4c + 1];
        sVar2 = bitVectorRead(vector,local_4c);
        bitVectorSet(vector_00,local_4c,sVar2);
        sVar2 = bitVectorRead(vector,local_4c + 1);
        bitVectorSet(vector_00,local_4c + 1,sVar2);
        local_4c = local_4c + 2;
      }
      *(DdHalfWord *)((long)Vcp + (long)local_4c * 4) = label;
      bitVectorSet(vector_00,local_4c,phase);
      *(DdHalfWord *)((long)Vcp + (long)(local_4c + 1) * 4) = 0x7fffffff;
      bitVectorSet(vector_00,local_4c + 1,1);
      *(DdHalfWord *)((long)Vcp + (long)(local_4c + 2) * 4) = 0;
      *(DdHalfWord *)((long)Vcp + (long)(local_4c + 3) * 4) = 0;
      bitVectorSet(vector_00,local_4c + 2,0);
      bitVectorSet(vector_00,local_4c + 3,0);
      return t;
    }
  }
  if ((Vcp != (BitVector *)0x0) && (Vcp != (BitVector *)0x0)) {
    free(Vcp);
  }
  if (t != (DdTlcInfo *)0x0) {
    Cudd_tlcInfoFree(t);
  }
  return (DdTlcInfo *)0x0;
}

Assistant:

static DdTlcInfo *
computeClausesWithUniverse(
  DdTlcInfo *Cres /* list of clauses for child */,
  DdHalfWord label /* variable labeling the current node */,
  short phase /* 0 if E child is zero; 1 if T child is zero */)
{
    DdHalfWord *Ccv = Cres->vars; /* variables of clauses for child */
    BitVector *Ccp = Cres->phases; /* phases of clauses for child */
    DdHalfWord *Vcv = NULL; /* pointer to the variables of the clauses for v */
    BitVector *Vcp = NULL; /* pointer to the phases of the clauses for v */
    DdTlcInfo *res = NULL; /* the set of clauses to be returned */
    int i;

    /* Initialize result. */
    res = tlcInfoAlloc();
    if (res == NULL) goto cleanup;
    /* Count entries for new list and allocate accordingly. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2);
    /* At this point, i is twice the number of clauses in the child's
    ** list.  We need four more entries for this node: 2 for the one-literal
    ** clause for the label, and 2 for the sentinel. */
    Vcv = ABC_ALLOC(DdHalfWord,i+4);
    if (Vcv == NULL) goto cleanup;
    Vcp = bitVectorAlloc(i+4);
    if (Vcp == NULL) goto cleanup;
    res->vars = Vcv;
    res->phases = Vcp;
    /* Copy old list into new. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2) {
        Vcv[i] = Ccv[i];
        Vcv[i+1] = Ccv[i+1];
        bitVectorSet(Vcp, i, bitVectorRead(Ccp, i));
        bitVectorSet(Vcp, i+1, bitVectorRead(Ccp, i+1));
    }
    /* Add clause corresponding to label. */
    Vcv[i] = label;
    bitVectorSet(Vcp, i, phase);
    i++;
    Vcv[i] = CUDD_MAXINDEX;
    bitVectorSet(Vcp, i, 1);
    i++;
    /* Add sentinel. */
    Vcv[i] = 0;
    Vcv[i+1] = 0;
    bitVectorSet(Vcp, i, 0);
    bitVectorSet(Vcp, i+1, 0);

    return(res);

 cleanup:
    /* Vcp is guaranteed to be NULL here.  Hence, we do not try to free it. */
    if (Vcv != NULL) ABC_FREE(Vcv);
    if (res != NULL) Cudd_tlcInfoFree(res);

    return(NULL);

}